

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

int zt_ptr_array_copy_data(zt_ptr_array *src,char **dstbuf)

{
  int32_t i;
  char **dstbuf_local;
  zt_ptr_array *src_local;
  int local_4;
  
  if ((src == (zt_ptr_array *)0x0) || (dstbuf == (char **)0x0)) {
    local_4 = -1;
  }
  else {
    for (i = 0; i < src->count; i = i + 1) {
      dstbuf[i] = (char *)src->array[i];
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
zt_ptr_array_copy_data(zt_ptr_array * src, char ** dstbuf) {
    int32_t i;

    if (src == NULL || dstbuf == NULL) {
        return -1;
    }

    for (i = 0; i < src->count; i++) {
        dstbuf[i] = src->array[i];
    }

    return 0;
}